

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  undefined2 *puVar2;
  byte bVar3;
  undefined1 *puVar4;
  uint nbBits;
  BIT_DStream_status BVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  BIT_DStream_t local_70;
  undefined2 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  if (bmi2 == 0) {
    sVar6 = BIT_initDStream(&local_70,cSrc,cSrcSize);
    if (sVar6 < 0xffffffffffffff89) {
      puVar2 = (undefined2 *)((long)dst + dstSize);
      nbBits = (uint)*(byte *)((long)DTable + 2);
      local_48 = (undefined2 *)((long)dst + (dstSize - 7));
      while ((BVar5 = BIT_reloadDStream(&local_70), dst < local_48 &&
             (BVar5 == BIT_DStream_unfinished))) {
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        *(short *)dst = (short)DTable[sVar6 + 1];
        uVar7 = *(byte *)((long)DTable + sVar6 * 4 + 6) + local_70.bitsConsumed;
        uVar8 = (ulong)*(byte *)((long)DTable + sVar6 * 4 + 7);
        local_40 = (undefined1 *)((long)dst + uVar8);
        local_70.bitsConsumed = uVar7;
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        puVar4 = local_40;
        *(short *)((long)dst + uVar8) = (short)DTable[sVar6 + 1];
        uVar7 = *(byte *)((long)DTable + sVar6 * 4 + 6) + uVar7;
        bVar3 = *(byte *)((long)DTable + sVar6 * 4 + 7);
        local_38 = local_40 + bVar3;
        local_70.bitsConsumed = uVar7;
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        *(short *)(puVar4 + bVar3) = (short)DTable[sVar6 + 1];
        uVar7 = *(byte *)((long)DTable + sVar6 * 4 + 6) + uVar7;
        uVar8 = (ulong)*(byte *)((long)DTable + sVar6 * 4 + 7);
        local_70.bitsConsumed = uVar7;
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        *(short *)(local_38 + uVar8) = (short)DTable[sVar6 + 1];
        local_70.bitsConsumed = *(byte *)((long)DTable + sVar6 * 4 + 6) + uVar7;
        dst = local_38 + *(byte *)((long)DTable + sVar6 * 4 + 7) + uVar8;
      }
      puVar1 = puVar2 + -1;
      while ((BVar5 = BIT_reloadDStream(&local_70), dst <= puVar1 &&
             (BVar5 == BIT_DStream_unfinished))) {
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        *(short *)dst = (short)DTable[sVar6 + 1];
        local_70.bitsConsumed = local_70.bitsConsumed + *(byte *)((long)DTable + sVar6 * 4 + 6);
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + sVar6 * 4 + 7));
      }
      for (; uVar7 = local_70.bitsConsumed, dst <= puVar1;
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + sVar6 * 4 + 7))) {
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        *(short *)dst = (short)DTable[sVar6 + 1];
        local_70.bitsConsumed = uVar7 + *(byte *)((long)DTable + sVar6 * 4 + 6);
      }
      if (dst < puVar2) {
        sVar6 = BIT_lookBitsFast(&local_70,nbBits);
        *(char *)dst = (char)DTable[sVar6 + 1];
        if (*(char *)((long)DTable + sVar6 * 4 + 7) == '\x01') {
          uVar7 = uVar7 + *(byte *)((long)DTable + sVar6 * 4 + 6);
        }
        else if (uVar7 < 0x40) {
          uVar7 = uVar7 + *(byte *)((long)DTable + sVar6 * 4 + 6);
          if (0x3f < uVar7) {
            uVar7 = 0x40;
          }
        }
      }
      if (local_70.ptr != local_70.start) {
        dstSize = 0xffffffffffffffec;
      }
      sVar6 = dstSize;
      if (uVar7 != 0x40) {
        sVar6 = 0xffffffffffffffec;
      }
    }
    return sVar6;
  }
  sVar6 = HUF_decompress1X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
  return sVar6;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}